

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O2

void __thiscall
Environment::putValue
          (Environment *this,Identifier *ident,Scope scope,ptr<Value> *value,bool constant)

{
  __shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2> *this_00;
  Symbol symbol;
  __shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2> _Stack_88;
  Identifier local_78;
  Symbol local_58;
  
  std::__cxx11::string::string((string *)&local_78,(string *)ident);
  Symbol::Symbol(&local_58,&local_78,constant,scope);
  std::__cxx11::string::~string((string *)&local_78);
  std::dynamic_pointer_cast<Member,Value>((shared_ptr<Value> *)&_Stack_88);
  this_00 = &std::__detail::
             _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,&local_58)->super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>
  ;
  std::__shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>::operator=(this_00,&_Stack_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_88._M_refcount);
  Symbol::~Symbol(&local_58);
  return;
}

Assistant:

void Environment::putValue(const Identifier &ident, Scope scope, ptr<Value> value, bool constant) {
    Symbol symbol(ident, constant, scope);
    symbols[symbol] = std::dynamic_pointer_cast<Member>(value);
}